

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O2

void __thiscall leveldb::log::Reader::ReportCorruption(Reader *this,uint64_t bytes,char *reason)

{
  Status SStack_48;
  Slice local_40;
  Slice local_30;
  
  local_30.data_ = reason;
  local_30.size_ = strlen(reason);
  local_40.data_ = "";
  local_40.size_ = 0;
  Status::Corruption(&SStack_48,&local_30,&local_40);
  ReportDrop(this,bytes,&SStack_48);
  Status::~Status(&SStack_48);
  return;
}

Assistant:

void Reader::ReportCorruption(uint64_t bytes, const char* reason) {
  ReportDrop(bytes, Status::Corruption(reason));
}